

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void av1_build_prediction_by_left_preds
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **tmp_buf,int *tmp_width,int *tmp_height,
               int *tmp_stride)

{
  void *in_RSI;
  overlappable_nb_visitor_t in_RDI;
  int unaff_retaddr;
  MACROBLOCKD *in_stack_00000008;
  BLOCK_SIZE bsize;
  build_prediction_ctxt ctxt;
  
  if ((*(byte *)((long)in_RSI + 0x1ec1) & 1) != 0) {
    foreach_overlappable_nb_left(ctxt.cm,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void av1_build_prediction_by_left_preds(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                        uint8_t *tmp_buf[MAX_MB_PLANE],
                                        int tmp_width[MAX_MB_PLANE],
                                        int tmp_height[MAX_MB_PLANE],
                                        int tmp_stride[MAX_MB_PLANE]) {
  if (!xd->left_available) return;
  struct build_prediction_ctxt ctxt = {
    cm, tmp_buf, tmp_width, tmp_height, tmp_stride, xd->mb_to_bottom_edge, NULL
  };
  BLOCK_SIZE bsize = xd->mi[0]->bsize;
  foreach_overlappable_nb_left(cm, xd,
                               max_neighbor_obmc[mi_size_high_log2[bsize]],
                               build_obmc_prediction, &ctxt);
}